

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloca.hpp
# Opt level: O0

void __thiscall
libtorrent::aux::alloca_destructor<libtorrent::aux::(anonymous_namespace)::busy_block_t>::
~alloca_destructor(alloca_destructor<libtorrent::aux::(anonymous_namespace)::busy_block_t> *this)

{
  index_type iVar1;
  busy_block_t *pbVar2;
  busy_block_t *o;
  busy_block_t *__end0;
  busy_block_t *__begin0;
  span<libtorrent::aux::(anonymous_namespace)::busy_block_t> *__range4;
  alloca_destructor<libtorrent::aux::(anonymous_namespace)::busy_block_t> *this_local;
  
  iVar1 = span<libtorrent::aux::(anonymous_namespace)::busy_block_t>::size(&this->objects);
  if (iVar1 < 0x201) {
    __end0 = span<libtorrent::aux::(anonymous_namespace)::busy_block_t>::begin(&this->objects);
    pbVar2 = span<libtorrent::aux::(anonymous_namespace)::busy_block_t>::end(&this->objects);
    for (; __end0 != pbVar2; __end0 = __end0 + 1) {
    }
  }
  else {
    pbVar2 = span<libtorrent::aux::(anonymous_namespace)::busy_block_t>::data(&this->objects);
    if (pbVar2 != (busy_block_t *)0x0) {
      operator_delete__(pbVar2);
    }
  }
  return;
}

Assistant:

~alloca_destructor()
	{
		if (objects.size() > cutoff)
		{
			delete [] objects.data();
		}
		else
		{
			for (auto& o : objects)
			{
				TORRENT_UNUSED(o);
				o.~T();
			}
		}
	}